

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__texture_env_color
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  undefined8 in_RAX;
  byte *pbVar7;
  StringHash SVar8;
  uint64 uVar9;
  char cVar10;
  xmlChar **ppxVar11;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pbVar7 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x28);
  uVar1 = texture_env_color__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar7 = texture_env_color__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar7 + 8) = uVar1;
  uVar4 = texture_env_color__AttributeData::DEFAULT._28_4_;
  uVar3 = texture_env_color__AttributeData::DEFAULT._24_4_;
  uVar2 = texture_env_color__AttributeData::DEFAULT._20_4_;
  *(undefined4 *)(pbVar7 + 0x10) = texture_env_color__AttributeData::DEFAULT._16_4_;
  *(undefined4 *)(pbVar7 + 0x14) = uVar2;
  *(undefined4 *)(pbVar7 + 0x18) = uVar3;
  *(undefined4 *)(pbVar7 + 0x1c) = uVar4;
  *(undefined8 *)(pbVar7 + 0x20) = texture_env_color__AttributeData::DEFAULT._32_8_;
  *attributeDataPtr = pbVar7;
  ppxVar11 = attributes->attributes;
  if (ppxVar11 != (xmlChar **)0x0) {
    do {
      text = *ppxVar11;
      if (text == (ParserChar *)0x0) {
        cVar10 = '\x03';
        goto LAB_006c404d;
      }
      SVar8 = GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar11[1];
      ppxVar11 = ppxVar11 + 2;
      if (SVar8 == 0x704ac8) {
        uVar9 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 7));
        *(uint64 *)(pbVar7 + 0x20) = uVar9;
        if (uStack_38._7_1_ == '\x01') {
          bVar5 = false;
          bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x8a9d882,0x704ac8,buffer);
          if (!bVar6) goto LAB_006c4034;
          cVar10 = '\x01';
        }
        else {
LAB_006c4034:
          cVar10 = '\x04';
          bVar5 = true;
          if (uStack_38._7_1_ == '\0') {
            *pbVar7 = *pbVar7 | 2;
          }
        }
        if (bVar5) goto LAB_006c404b;
      }
      else if (SVar8 == 0x76887d) {
        *(ParserChar **)(pbVar7 + 0x18) = buffer;
LAB_006c404b:
        cVar10 = '\0';
      }
      else if (SVar8 == 0x7c83b5) {
        bVar5 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                           ,buffer,(XSList<float> *)(pbVar7 + 8));
        if (bVar5) {
          *pbVar7 = *pbVar7 | 1;
          cVar10 = '\x04';
          bVar5 = true;
        }
        else {
          bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x8a9d882,0x7c83b5,buffer);
          bVar5 = !bVar5;
          cVar10 = bVar5 * '\x03' + '\x01';
        }
        if (bVar5) goto LAB_006c404b;
      }
      else {
        bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x8a9d882,text,buffer);
        cVar10 = '\x01';
        if (!bVar5) goto LAB_006c404b;
      }
LAB_006c404d:
    } while (cVar10 == '\0');
    if (cVar10 != '\x03') {
      return false;
    }
  }
  if ((*pbVar7 & 1) == 0) {
    pbVar7[8] = 0;
    pbVar7[9] = 0;
    pbVar7[10] = 0;
    pbVar7[0xb] = 0;
    pbVar7[0xc] = 0;
    pbVar7[0xd] = 0;
    pbVar7[0xe] = 0;
    pbVar7[0xf] = 0;
    pbVar7[0x10] = 0;
    pbVar7[0x11] = 0;
    pbVar7[0x12] = 0;
    pbVar7[0x13] = 0;
    pbVar7[0x14] = 0;
    pbVar7[0x15] = 0;
    pbVar7[0x16] = 0;
    pbVar7[0x17] = 0;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__texture_env_color( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__texture_env_color( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

texture_env_color__AttributeData* attributeData = newData<texture_env_color__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_TEXTURE_ENV_COLOR, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE_ENV_COLOR,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXTURE_ENV_COLOR,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= texture_env_color__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXTURE_ENV_COLOR,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE_ENV_COLOR,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= texture_env_color__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TEXTURE_ENV_COLOR, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & texture_env_color__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    attributeData->value = GeneratedSaxParser::XSList<float>();
}


    return true;
}